

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if.c
# Opt level: O2

void t5(void)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  uint uVar4;
  gpioPulse_t wf [4];
  char text [2048];
  
  wf[2].usDelay = 60000;
  wf[3].gpioOn = 0;
  wf[3].gpioOff = 0x2000000;
  wf[3].usDelay = 100000;
  wf[1].gpioOff = 0x2000000;
  wf[1].usDelay = 30000;
  wf[2].gpioOn = 0x2000000;
  wf[2].gpioOff = 0;
  wf[0].gpioOn = 0x2000000;
  wf[0].gpioOff = 0;
  wf[0].usDelay = 10000;
  wf[1].gpioOn = 0;
  puts("Waveforms & serial read/write tests.");
  callback(0x19,1,t5cbf);
  set_mode(0x19,1);
  iVar1 = wave_clear();
  CHECK(5,1,iVar1,0,0,"callback, set mode, wave clear");
  iVar1 = wave_add_generic(4,wf);
  CHECK(5,2,iVar1,4,0,"pulse, wave add generic");
  uVar2 = wave_create();
  iVar3 = wave_send_repeat(uVar2);
  iVar1 = 0x13;
  if (iVar3 < 0xe) {
    iVar1 = 9;
  }
  CHECK(5,3,iVar3,iVar1,0,"wave tx repeat");
  iVar1 = t5_count;
  time_sleep(0x33333333);
  CHECK(5,4,t5_count - iVar1,0x32,2,"callback");
  iVar1 = wave_tx_stop();
  CHECK(5,5,iVar1,0,0,"wave tx stop");
  iVar1 = bb_serial_read_open(0x19,0x12c0,8);
  CHECK(5,6,iVar1,0,0,"serial read open");
  wave_clear();
  iVar1 = wave_add_serial(0x19,0x12c0,8,2,5000000,0x22c,
                          "\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                         );
  CHECK(5,7,iVar1,0xd4d,0,"wave clear, wave add serial");
  uVar2 = wave_create();
  iVar1 = wave_send_once(uVar2);
  iVar3 = 0x1bcc;
  if (iVar1 < 0x1b34) {
    iVar3 = 0x1a9b;
  }
  CHECK(5,8,iVar1,iVar3,0,"wave tx start");
  iVar1 = t5_count;
  time_sleep(0);
  CHECK(5,9,t5_count - iVar1,0,0,"callback");
  iVar1 = t5_count;
  do {
    iVar3 = wave_tx_busy();
    time_sleep(0x9999999a);
  } while (iVar3 != 0);
  CHECK(5,10,t5_count - iVar1,0x6a6,0,"wave tx busy, callback");
  uVar4 = bb_serial_read(0x19,text,0x7ff);
  if (0 < (int)uVar4) {
    text[uVar4] = '\0';
  }
  iVar1 = strcmp("\nNow is the winter of our discontent\nMade glorious summer by this sun of York;\nAnd all the clouds that lour\'d upon our house\nIn the deep bosom of the ocean buried.\nNow are our brows bound with victorious wreaths;\nOur bruised arms hung up for monuments;\nOur stern alarums changed to merry meetings,\nOur dreadful marches to delightful measures.\nGrim-visaged war hath smooth\'d his wrinkled front;\nAnd now, instead of mounting barded steeds\nTo fright the souls of fearful adversaries,\nHe capers nimbly in a lady\'s chamber\nTo the lascivious pleasing of a lute.\n"
                 ,text);
  CHECK(5,0xb,iVar1,0,0,"wave tx busy, serial read");
  iVar1 = bb_serial_read_close(0x19);
  CHECK(5,0xc,iVar1,0,0,"serial read close");
  iVar1 = wave_get_micros();
  CHECK(5,0xd,iVar1,0x5df744,0,"wave get micros");
  iVar1 = wave_get_high_micros();
  if (0x5df743 < iVar1) {
    iVar1 = 0x5df744;
  }
  CHECK(5,0xe,iVar1,0x5df744,0,"wave get high micros");
  iVar1 = wave_get_max_micros();
  CHECK(5,0xf,iVar1,1800000000,0,"wave get max micros");
  iVar1 = wave_get_pulses();
  CHECK(5,0x10,iVar1,0xd4d,0,"wave get pulses");
  iVar1 = wave_get_high_pulses();
  CHECK(5,0x11,iVar1,0xd4d,0,"wave get high pulses");
  iVar1 = wave_get_max_pulses();
  CHECK(5,0x12,iVar1,12000,0,"wave get max pulses");
  iVar1 = wave_get_cbs();
  iVar3 = 0x1bcb;
  if (iVar1 < 0x1b33) {
    iVar3 = 0x1a9a;
  }
  CHECK(5,0x13,iVar1,iVar3,0,"wave get cbs");
  iVar3 = wave_get_high_cbs();
  iVar1 = 0x1bcb;
  if (iVar3 < 0x1b33) {
    iVar1 = 0x1a9a;
  }
  CHECK(5,0x14,iVar3,iVar1,0,"wave get high cbs");
  iVar1 = wave_get_max_cbs();
  CHECK(5,0x15,iVar1,0x61b8,0,"wave get max cbs");
  return;
}

Assistant:

void t5()
{
   int BAUD=4800;

   char *TEXT=
"\n\
Now is the winter of our discontent\n\
Made glorious summer by this sun of York;\n\
And all the clouds that lour'd upon our house\n\
In the deep bosom of the ocean buried.\n\
Now are our brows bound with victorious wreaths;\n\
Our bruised arms hung up for monuments;\n\
Our stern alarums changed to merry meetings,\n\
Our dreadful marches to delightful measures.\n\
Grim-visaged war hath smooth'd his wrinkled front;\n\
And now, instead of mounting barded steeds\n\
To fright the souls of fearful adversaries,\n\
He capers nimbly in a lady's chamber\n\
To the lascivious pleasing of a lute.\n\
";

   gpioPulse_t wf[] =
   {
      {1<<GPIO, 0,  10000},
      {0, 1<<GPIO,  30000},
      {1<<GPIO, 0,  60000},
      {0, 1<<GPIO, 100000},
   };

   int e, oc, c, wid;

   char text[2048];

   printf("Waveforms & serial read/write tests.\n");

   callback(GPIO, FALLING_EDGE, t5cbf);

   set_mode(GPIO, PI_OUTPUT);

   e = wave_clear();
   CHECK(5, 1, e, 0, 0, "callback, set mode, wave clear");

   e = wave_add_generic(4, wf);
   CHECK(5, 2, e, 4, 0, "pulse, wave add generic");

   wid = wave_create();
   e = wave_send_repeat(wid);
   if (e < 14) CHECK(5, 3, e,  9, 0, "wave tx repeat");
   else        CHECK(5, 3, e, 19, 0, "wave tx repeat");

   oc = t5_count;
   time_sleep(5.05);
   c = t5_count - oc;
   CHECK(5, 4, c, 50, 2, "callback");

   e = wave_tx_stop();
   CHECK(5, 5, e, 0, 0, "wave tx stop");

   e = bb_serial_read_open(GPIO, BAUD, 8);
   CHECK(5, 6, e, 0, 0, "serial read open");

   wave_clear();
   e = wave_add_serial(GPIO, BAUD, 8, 2, 5000000, strlen(TEXT), TEXT);
   CHECK(5, 7, e, 3405, 0, "wave clear, wave add serial");

   wid = wave_create();
   e = wave_send_once(wid);
   if (e < 6964) CHECK(5, 8, e, 6811, 0, "wave tx start");
   else          CHECK(5, 8, e, 7116, 0, "wave tx start");

   oc = t5_count;
   time_sleep(3);
   c = t5_count - oc;
   CHECK(5, 9, c, 0, 0, "callback");

   oc = t5_count;
   while (wave_tx_busy()) time_sleep(0.1);
   time_sleep(0.1);
   c = t5_count - oc;
   CHECK(5, 10, c, 1702, 0, "wave tx busy, callback");

   c = bb_serial_read(GPIO, text, sizeof(text)-1);
   if (c > 0) text[c] = 0; /* null terminate string */
   CHECK(5, 11, strcmp(TEXT, text), 0, 0, "wave tx busy, serial read");

   e = bb_serial_read_close(GPIO);
   CHECK(5, 12, e, 0, 0, "serial read close");

   c = wave_get_micros();
   CHECK(5, 13, c, 6158148, 0, "wave get micros");

   c = wave_get_high_micros();
   if (c > 6158148) c = 6158148;
   CHECK(5, 14, c, 6158148, 0, "wave get high micros");

   c = wave_get_max_micros();
   CHECK(5, 15, c, 1800000000, 0, "wave get max micros");

   c = wave_get_pulses();
   CHECK(5, 16, c, 3405, 0, "wave get pulses");

   c = wave_get_high_pulses();
   CHECK(5, 17, c, 3405, 0, "wave get high pulses");

   c = wave_get_max_pulses();
   CHECK(5, 18, c, 12000, 0, "wave get max pulses");

   c = wave_get_cbs();
   if (c < 6963) CHECK(5, 19, c, 6810, 0, "wave get cbs");
   else          CHECK(5, 19, c, 7115, 0, "wave get cbs");

   c = wave_get_high_cbs();
   if (c < 6963) CHECK(5, 20, c, 6810, 0, "wave get high cbs");
   else          CHECK(5, 20, c, 7115, 0, "wave get high cbs");

   c = wave_get_max_cbs();
   CHECK(5, 21, c, 25016, 0, "wave get max cbs");
}